

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall fmt::v8::detail::count_digits<3,unsigned__int128>(detail *this,unsigned___int128 n)

{
  undefined1 m [16];
  int iVar1;
  undefined8 in_RSI;
  anon_class_1_0_00000001 local_29;
  detail *local_28;
  unsigned___int128 n_local;
  
  m._8_8_ = in_RSI;
  m._0_8_ = this;
  local_28 = this;
  n_local._8_8_ = this;
  iVar1 = count_digits<3,_unsigned___int128>::anon_class_1_0_00000001::operator()
                    (&local_29,(unsigned___int128)m);
  return iVar1;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  // Lambda avoids unreachable code warnings from NVHPC.
  return [](UInt m) {
    int num_digits = 0;
    do {
      ++num_digits;
    } while ((m >>= BITS) != 0);
    return num_digits;
  }(n);
}